

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O2

boolean can_pray(boolean praying)

{
  boolean bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  
  p_aligntyp = u.ualign.type;
  if (level->locations[u.ux][u.uy].typ == '!') {
    uVar2 = *(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 4 & 7;
    if (uVar2 == 0) {
      p_aligntyp = -0x80;
    }
    else if (uVar2 == 4) {
      p_aligntyp = '\x01';
    }
    else {
      p_aligntyp = (char)uVar2 + -2;
    }
  }
  p_trouble = in_trouble();
  if ((p_aligntyp != -1 & *(byte *)((long)&(youmonst.data)->mflags2 + 1) >> 1) == 1) {
    if (praying == '\0') {
      return '\0';
    }
    pcVar4 = "lawful";
    if (p_aligntyp == '\0') {
      pcVar4 = "neutral";
    }
    pline("The very idea of praying to a %s god is repugnant to you.",pcVar4);
    return '\0';
  }
  if (praying != '\0') {
    pcVar4 = align_gname(p_aligntyp);
    pline("You begin praying to %s.",pcVar4);
  }
  if ((u.ualign.type == '\0') || ((int)p_aligntyp + (int)u.ualign.type != 0)) {
    iVar3 = u.ualign.record;
    if (u.ualign.type != p_aligntyp) {
      iVar3 = u.ualign.record / 2;
    }
  }
  else {
    iVar3 = -u.ualign.record;
  }
  if (p_trouble < 1) {
    if (p_trouble < 0) {
      if (100 < u.ublesscnt) goto LAB_00216e67;
    }
    else if (0 < u.ublesscnt) {
LAB_00216e67:
      p_type = 0;
      goto LAB_00216e69;
    }
  }
  else if (200 < u.ublesscnt) goto LAB_00216e67;
  p_type = 1;
  if (((-1 < (int)u.moreluck + (int)u.uluck) && (u.ugangr == 0)) && (-1 < iVar3)) {
    p_type = (u.ualign.type == p_aligntyp || level->locations[u.ux][u.uy].typ != '!') | 2;
  }
LAB_00216e69:
  if (((((youmonst.data)->mflags2 & 2) != 0) && (bVar1 = In_hell(&u.uz), bVar1 == '\0')) &&
     ((p_aligntyp == '\x01' || ((p_aligntyp == '\0' && (uVar2 = mt_random(), uVar2 % 10 == 0)))))) {
    p_type = -1;
  }
  if (praying == '\0') {
    if (p_type != 3) {
      return '\0';
    }
    bVar1 = In_hell(&u.uz);
    return bVar1 == '\0';
  }
  return '\x01';
}

Assistant:

boolean can_pray(boolean praying)
{
    int alignment;

    p_aligntyp = on_altar() ? a_align(u.ux,u.uy) : u.ualign.type;
    p_trouble = in_trouble();

    if (is_demon(youmonst.data) && (p_aligntyp != A_CHAOTIC)) {
	if (praying)
	    pline("The very idea of praying to a %s god is repugnant to you.",
		  p_aligntyp ? "lawful" : "neutral");
	return FALSE;
    }

    if (praying)
	pline("You begin praying to %s.", align_gname(p_aligntyp));

    if (u.ualign.type && u.ualign.type == -p_aligntyp)
	alignment = -u.ualign.record;		/* Opposite alignment altar */
    else if (u.ualign.type != p_aligntyp)
	alignment = u.ualign.record / 2;	/* Different alignment altar */
    else alignment = u.ualign.record;

    if ((p_trouble > 0) ? (u.ublesscnt > 200) : /* big trouble */
	(p_trouble < 0) ? (u.ublesscnt > 100) : /* minor difficulties */
	(u.ublesscnt > 0))			/* not in trouble */
	p_type = 0;		/* too soon... */
    else if ((int)Luck < 0 || u.ugangr || alignment < 0)
	p_type = 1;		/* too naughty... */
    else /* alignment >= 0 */ {
	if (on_altar() && u.ualign.type != p_aligntyp)
	    p_type = 2;
	else
	    p_type = 3;
    }

    if (is_undead(youmonst.data) && !Inhell &&
	(p_aligntyp == A_LAWFUL || (p_aligntyp == A_NEUTRAL && !rn2(10))))
	p_type = -1;
    /* Note:  when !praying, the random factor for neutrals makes the
       return value a non-deterministic approximation for enlightenment.
       This case should be uncommon enough to live with... */

    return !praying ? (boolean)(p_type == 3 && !Inhell) : TRUE;
}